

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

BOOL __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::IsValidObject
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  char *pcVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  ushort uVar6;
  uint uVar7;
  undefined8 *in_FS_OFFSET;
  
  pcVar1 = (this->super_HeapBlock).address;
  uVar7 = 0;
  if (objectAddress < pcVar1 + 0x1000 && pcVar1 <= objectAddress) {
    uVar6 = GetAddressIndex(this,objectAddress);
    if (uVar6 != 0xffff) {
      if (((ulong)objectAddress & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar2 = (undefined4 *)*in_FS_OFFSET;
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar2 = 0;
      }
      BVar5 = BVStatic<256UL>::Test(&this->debugFreeBits,(uint)((ulong)objectAddress >> 4) & 0xff);
      uVar7 = (uint)(BVar5 == '\0');
    }
  }
  return uVar7;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsValidObject(void* objectAddress)
{
    if (objectAddress < this->GetAddress() || objectAddress >= this->GetEndAddress())
    {
        return false;
    }
    ushort index = GetAddressIndex(objectAddress);
    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }
#if DBG
    return !this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(objectAddress));
#else
    return true;
#endif
}